

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapDrive.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_580a1::MapDrivePlugIn::printMiniHelpForFunctionKeys(MapDrivePlugIn *this)

{
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  ostringstream message;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&message);
  std::operator<<((ostream *)&message,"Function keys handled by ");
  poVar2 = std::operator<<((ostream *)&message,'\"');
  iVar1 = (*(this->super_PlugIn).super_AbstractPlugIn._vptr_AbstractPlugIn[7])(this);
  poVar2 = std::operator<<(poVar2,(char *)CONCAT44(extraout_var,iVar1));
  poVar2 = std::operator<<(poVar2,'\"');
  poVar2 = std::operator<<(poVar2,':');
  std::ends<char,std::char_traits<char>>(poVar2);
  OpenSteer::OpenSteerDemo::printMessage(&message);
  OpenSteer::OpenSteerDemo::printMessage("  F1     select next driving demo.");
  OpenSteer::OpenSteerDemo::printMessage("  F2     reverse path following direction.");
  OpenSteer::OpenSteerDemo::printMessage("  F3     toggle path fences.");
  OpenSteer::OpenSteerDemo::printMessage("  F4     toggle random rock clumps.");
  OpenSteer::OpenSteerDemo::printMessage("  F5     toggle curved prediction.");
  OpenSteer::OpenSteerDemo::printMessage("");
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&message);
  return;
}

Assistant:

void printMiniHelpForFunctionKeys (void)
        {
            std::ostringstream message;
            message << "Function keys handled by ";
            message << '"' << name() << '"' << ':' << std::ends;
            OpenSteerDemo::printMessage (message);
            OpenSteerDemo::printMessage ("  F1     select next driving demo.");
            OpenSteerDemo::printMessage ("  F2     reverse path following direction.");
            OpenSteerDemo::printMessage ("  F3     toggle path fences.");
            OpenSteerDemo::printMessage ("  F4     toggle random rock clumps.");
            OpenSteerDemo::printMessage ("  F5     toggle curved prediction.");
            OpenSteerDemo::printMessage ("");
        }